

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr1502.cpp
# Opt level: O2

double IKasin(double f)

{
  ostream *poVar1;
  runtime_error *this;
  double dVar2;
  string local_1c0 [32];
  stringstream ss;
  ostream local_190 [376];
  
  if (1.0000001 <= ABS(f)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar1 = std::operator<<(local_190,"ikfast exception: ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Simon-Steinmann[P]ikfast_pybind_PR/src/kukakr1502/ikfast61_kukakr1502.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x84);
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,"IKasin");
    poVar1 = std::operator<<(poVar1,": Assertion \'");
    poVar1 = std::operator<<(poVar1,"f > -1-IKFAST_SINCOS_THRESH && f < 1+IKFAST_SINCOS_THRESH");
    std::operator<<(poVar1,"\' failed");
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this,local_1c0);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (f <= -1.0) {
    dVar2 = -1.5707963267949;
  }
  else {
    if (f < 1.0) {
      dVar2 = asin(f);
      return dVar2;
    }
    dVar2 = 1.5707963267949;
  }
  return dVar2;
}

Assistant:

inline double IKasin(double f)
{
IKFAST_ASSERT( f > -1-IKFAST_SINCOS_THRESH && f < 1+IKFAST_SINCOS_THRESH ); // any more error implies something is wrong with the solver
if( f <= -1 ) return -IKPI_2;
else if( f >= 1 ) return IKPI_2;
return asin(f);
}